

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O0

void ncnn::conv1x1s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  int size_1;
  float *r0_1;
  float k0_1;
  float *kernel0_1;
  float *img0_1;
  float *outptr_1;
  float sum3;
  float sum2;
  float sum1;
  float sum;
  int remain;
  int size;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float k3;
  float k2;
  float k1;
  float k0;
  float *kernel0;
  float *img3;
  float *img2;
  float *img1;
  float *img0;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  float *in_stack_fffffffffffffd20;
  Mat *in_stack_fffffffffffffd28;
  Mat *in_stack_fffffffffffffd30;
  float local_298;
  int local_290;
  float *local_288;
  Mat local_270;
  float *local_230;
  float *local_228;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  int local_210;
  int local_20c;
  Mat *local_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float *local_1d8;
  Mat local_1d0;
  Mat *local_190;
  Mat local_188;
  float *local_148;
  Mat local_140;
  float *local_100;
  Mat local_f8;
  float *local_b8;
  float *local_b0;
  int local_a8;
  float local_94;
  Mat local_90;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x34);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_38; local_4c = local_4c + 1) {
    Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    if (local_48 == (float *)0x0) {
      local_298 = 0.0;
    }
    else {
      local_298 = local_48[local_4c];
    }
    local_94 = local_298;
    Mat::fill(in_stack_fffffffffffffd30,(float)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    for (local_a8 = 0; local_a8 + 3 < local_2c; local_a8 = local_a8 + 4) {
      local_b0 = Mat::operator_cast_to_float_(&local_90);
      Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_f8);
      Mat::~Mat((Mat *)0x12f368);
      local_b8 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_140);
      Mat::~Mat((Mat *)0x12f3b6);
      local_100 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      in_stack_fffffffffffffd30 = &local_188;
      pfVar2 = Mat::operator_cast_to_float_(in_stack_fffffffffffffd30);
      Mat::~Mat((Mat *)0x12f405);
      local_148 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      in_stack_fffffffffffffd28 = (Mat *)Mat::operator_cast_to_float_(&local_1d0);
      Mat::~Mat((Mat *)0x12f452);
      local_1d8 = local_40 + (long)(local_4c * local_2c) + (long)local_a8;
      local_1dc = *local_1d8;
      local_1e0 = local_1d8[1];
      local_1e4 = local_1d8[2];
      local_1e8 = local_1d8[3];
      local_1f0 = local_b8;
      local_1f8 = local_100;
      local_200 = local_148;
      local_20c = local_30 * local_34;
      local_208 = in_stack_fffffffffffffd28;
      for (local_210 = local_20c; 0 < local_210; local_210 = local_210 + -1) {
        local_214 = *local_1f0 * local_1dc;
        local_218 = *local_1f8 * local_1e0;
        local_21c = *local_200 * local_1e4;
        local_220 = *(float *)&local_208->data * local_1e8;
        *local_b0 = local_214 + local_218 + local_21c + local_220 + *local_b0;
        local_1f0 = local_1f0 + 1;
        local_1f8 = local_1f8 + 1;
        local_200 = local_200 + 1;
        local_208 = (Mat *)((long)&local_208->data + 4);
        local_b0 = local_b0 + 1;
      }
      local_190 = in_stack_fffffffffffffd28;
    }
    for (; local_a8 < local_2c; local_a8 = local_a8 + 1) {
      in_stack_fffffffffffffd20 = Mat::operator_cast_to_float_(&local_90);
      local_228 = in_stack_fffffffffffffd20;
      Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_270);
      Mat::~Mat((Mat *)0x12f72e);
      fVar1 = local_40[(long)(local_4c * local_2c) + (long)local_a8];
      local_288 = pfVar2;
      for (local_290 = local_30 * local_34; 0 < local_290; local_290 = local_290 + -1) {
        *local_228 = *local_288 * fVar1 + *local_228;
        local_288 = local_288 + 1;
        local_228 = local_228 + 1;
      }
      local_230 = pfVar2;
    }
    Mat::~Mat((Mat *)0x12f82c);
  }
  return;
}

Assistant:

static void conv1x1s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;
                float sum1 = *r1 * k1;
                float sum2 = *r2 * k2;
                float sum3 = *r3 * k3;

                *outptr += sum + sum1 + sum2 + sum3;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;

                *outptr += sum;

                r0++;
                outptr++;
            }

        }
    }

}